

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyFromBuffer::prepare
          (BufferCopyFromBuffer *this,PrepareContext *context)

{
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)7>_> *pMVar2;
  Context *pCVar3;
  DeviceInterface *vk;
  VkPhysicalDevice physicalDevice;
  VkDevice pVVar4;
  VkBuffer obj;
  VkDeviceMemory obj_00;
  Handle<(vk::HandleType)7> HVar5;
  DeviceInterface *pDVar6;
  VkAllocationCallbacks *pVVar7;
  undefined8 uVar8;
  VkResult result;
  deUint32 dVar9;
  ulong size;
  ulong uVar10;
  Random rng;
  VkMemoryPropertyFlags in_stack_ffffffffffffff38;
  Move<vk::Handle<(vk::HandleType)7>_> local_b8;
  VkDevice local_90;
  undefined1 local_88 [20];
  uint uStack_74;
  VkAllocationCallbacks *pVStack_70;
  undefined8 local_68;
  deUint32 local_60;
  pointer local_58;
  InstanceInterface *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pCVar3 = context->m_context;
  local_50 = pCVar3->m_vki;
  vk = pCVar3->m_vkd;
  physicalDevice = pCVar3->m_physicalDevice;
  pVVar4 = pCVar3->m_device;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48,&pCVar3->m_queueFamilies);
  pVStack_70 = (VkAllocationCallbacks *)context->m_currentBufferSize;
  this->m_bufferSize = (VkDeviceSize)pVStack_70;
  local_88._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_88._8_8_ = (void *)0x0;
  stack0xffffffffffffff88 = (VkDevice)((ulong)uStack_74 << 0x20);
  local_68._0_4_ = 1;
  local_68._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  local_60 = (deUint32)
             ((ulong)((long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_58 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_90 = pVVar4;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_b8,vk,pVVar4,
                     (VkBufferCreateInfo *)local_88,(VkAllocationCallbacks *)0x0);
  pVVar7 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  pVVar4 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  pDVar6 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  HVar5.m_internal = local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
  ;
  stack0xffffffffffffff88 =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  pVStack_70 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  local_88._0_8_ = local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  local_88._8_8_ =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar1 = &this->m_srcBuffer;
  obj.m_internal =
       (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         pVVar4;
    (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         pVVar7;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         HVar5.m_internal;
    (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         pDVar6;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,obj
              );
    (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         stack0xffffffffffffff88;
    (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         pVStack_70;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         local_88._0_8_;
    (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_88._8_8_;
    if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)
                 &local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
                 (VkBuffer)
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal);
    }
  }
  bindBufferMemory(&local_b8,local_50,vk,physicalDevice,local_90,
                   (VkBuffer)
                   (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal,
                   in_stack_ffffffffffffff38);
  pVVar7 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  pVVar4 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  pDVar6 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  HVar5.m_internal = local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
  ;
  stack0xffffffffffffff88 =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  pVStack_70 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  local_88._0_8_ = local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  local_88._8_8_ =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar2 = &this->m_memory;
  obj_00.m_internal =
       (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  if (obj_00.m_internal == 0) {
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = pVVar4;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
         pVVar7;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal =
         HVar5.m_internal;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
         pDVar6;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,obj_00
              );
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
         stack0xffffffffffffff88;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
         pVStack_70;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal =
         local_88._0_8_;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_88._8_8_;
    if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
                 (VkDeviceMemory)
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal);
    }
  }
  result = (*vk->_vptr_DeviceInterface[7])
                     (vk,local_90,
                      (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                      m_internal,0,this->m_bufferSize,0,(VkBufferCreateInfo *)local_88);
  ::vk::checkResult(result,"vkd.mapMemory(device, memory, 0, size, 0, &ptr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x2b3);
  uVar8 = local_88._0_8_;
  deRandom_init((deRandom *)local_88,this->m_seed);
  if (this->m_bufferSize == 0) {
    size = 0;
  }
  else {
    uVar10 = 0;
    do {
      dVar9 = deRandom_getUint32((deRandom *)local_88);
      *(char *)(uVar8 + uVar10) = (char)dVar9;
      uVar10 = uVar10 + 1;
      size = this->m_bufferSize;
    } while (uVar10 < size);
  }
  pVVar4 = local_90;
  ::vk::flushMappedMemoryRange
            (vk,local_90,
             (VkDeviceMemory)
             (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal,0,size
            );
  (*vk->_vptr_DeviceInterface[8])
            (vk,pVVar4,
             (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BufferCopyFromBuffer::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_bufferSize	= context.getBufferSize();
	m_srcBuffer		= createBuffer(vkd, device, m_bufferSize, vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies);
	m_memory		= bindBufferMemory(vki, vkd, physicalDevice, device, *m_srcBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT);

	{
		void* const	ptr	= mapMemory(vkd, device, *m_memory, m_bufferSize);
		de::Random	rng	(m_seed);

		{
			deUint8* const	data = (deUint8*)ptr;

			for (size_t ndx = 0; ndx < (size_t)m_bufferSize; ndx++)
				data[ndx] = rng.getUint8();
		}

		vk::flushMappedMemoryRange(vkd, device, *m_memory, 0, m_bufferSize);
		vkd.unmapMemory(device, *m_memory);
	}
}